

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_block_tests.cpp
# Opt level: O0

shared_ptr<CBlock> __thiscall
validation_block_tests::MinerTestingSetup::FinalizeBlock
          (MinerTestingSetup *this,shared_ptr<CBlock> *pblock)

{
  long lVar1;
  uint256 hash;
  span<const_CBlockHeader,_18446744073709551615UL> headers;
  bool bVar2;
  pointer state;
  element_type *peVar3;
  undefined8 in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  CBlockIndex **in_RSI;
  element_type *in_RDI;
  long in_FS_OFFSET;
  shared_ptr<CBlock> sVar4;
  CBlockIndex *prev_block;
  BlockValidationState ignored;
  CChainParams *in_stack_fffffffffffffdb8;
  lazy_ostream *prev;
  __shared_ptr_access<CBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false> *in_stack_fffffffffffffdc8;
  CBlock *this_00;
  CBlockHeader *in_stack_fffffffffffffdd8;
  undefined7 in_stack_fffffffffffffde0;
  undefined1 in_stack_fffffffffffffde7;
  lazy_ostream *in_stack_fffffffffffffde8;
  undefined7 in_stack_fffffffffffffdf0;
  undefined1 in_stack_fffffffffffffdf7;
  pointer in_stack_fffffffffffffdf8;
  undefined4 in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe14;
  element_type *peVar5;
  undefined7 uVar6;
  uchar min_pow_checked;
  ChainstateManager *in_stack_fffffffffffffe40;
  const_string local_190;
  CBlockIndex *in_stack_fffffffffffffe80;
  CBlock *in_stack_fffffffffffffe88;
  ChainstateManager *in_stack_fffffffffffffe90;
  undefined8 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  CChainParams *local_48;
  lazy_ostream *local_40;
  CBlock *local_38;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  
  uVar6 = (undefined7)in_RDX;
  min_pow_checked = (uchar)((ulong)in_RDX >> 0x38);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  peVar5 = in_RDI;
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffdb8);
  FinalizeBlock::anon_class_16_2_4d915a18::operator()
            ((anon_class_16_2_4d915a18 *)in_stack_fffffffffffffde8);
  state = std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
                    ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
                     in_stack_fffffffffffffdb8);
  std::__shared_ptr_access<CBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
            (in_stack_fffffffffffffdc8);
  ChainstateManager::GenerateCoinbaseCommitment
            (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffdc8);
  std::__shared_ptr_access<CBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
            (in_stack_fffffffffffffdc8);
  BlockMerkleRoot(in_RDI,(bool *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
  peVar3 = std::__shared_ptr_access<CBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<CBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      in_stack_fffffffffffffdb8);
  *(undefined8 *)(peVar3->super_CBlockHeader).hashMerkleRoot.super_base_blob<256U>.m_data._M_elems =
       local_28;
  *(undefined8 *)
   ((peVar3->super_CBlockHeader).hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 8) =
       local_20;
  *(undefined8 *)
   ((peVar3->super_CBlockHeader).hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x10) =
       local_18;
  *(undefined8 *)
   ((peVar3->super_CBlockHeader).hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x18) =
       local_10;
  while( true ) {
    std::__shared_ptr_access<CBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<CBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_fffffffffffffdb8);
    CBlockHeader::GetHash(in_stack_fffffffffffffdd8);
    std::__shared_ptr_access<CBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<CBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_fffffffffffffdb8);
    Params();
    CChainParams::GetConsensus(in_stack_fffffffffffffdb8);
    hash.super_base_blob<256U>.m_data._M_elems._8_8_ = in_RSI;
    hash.super_base_blob<256U>.m_data._M_elems._0_8_ = peVar5;
    hash.super_base_blob<256U>.m_data._M_elems._16_8_ = state;
    hash.super_base_blob<256U>.m_data._M_elems[0x18] = (char)uVar6;
    hash.super_base_blob<256U>.m_data._M_elems[0x19] = (char)((uint7)uVar6 >> 8);
    hash.super_base_blob<256U>.m_data._M_elems[0x1a] = (char)((uint7)uVar6 >> 0x10);
    hash.super_base_blob<256U>.m_data._M_elems[0x1b] = (char)((uint7)uVar6 >> 0x18);
    hash.super_base_blob<256U>.m_data._M_elems[0x1c] = (char)((uint7)uVar6 >> 0x20);
    hash.super_base_blob<256U>.m_data._M_elems[0x1d] = (char)((uint7)uVar6 >> 0x28);
    hash.super_base_blob<256U>.m_data._M_elems[0x1e] = (char)((uint7)uVar6 >> 0x30);
    hash.super_base_blob<256U>.m_data._M_elems[0x1f] = min_pow_checked;
    in_stack_fffffffffffffdb8 = local_48;
    prev = local_40;
    this_00 = local_38;
    bVar2 = CheckProofOfWork(hash,(uint)((ulong)in_stack_fffffffffffffde8 >> 0x20),
                             (Params *)CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0)
                            );
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    peVar3 = std::__shared_ptr_access<CBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<CBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        in_stack_fffffffffffffdb8);
    (peVar3->super_CBlockHeader).nNonce = (peVar3->super_CBlockHeader).nNonce + 1;
  }
  BlockValidationState::BlockValidationState((BlockValidationState *)in_stack_fffffffffffffdb8);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_00,(pointer)prev,
               (unsigned_long)in_stack_fffffffffffffdb8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffdb8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffffdf8,
               (const_string *)CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0),
               (size_t)in_stack_fffffffffffffde8,
               (const_string *)CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0));
    inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
              ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
               in_stack_fffffffffffffdf8,
               (char *)CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0),
               (int)((ulong)in_stack_fffffffffffffde8 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0),
               (char *)in_stack_fffffffffffffdd8);
    in_stack_fffffffffffffdf8 =
         std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
                   ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
                    in_stack_fffffffffffffdb8);
    std::__shared_ptr_access<CBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<CBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_fffffffffffffdb8);
    CBlock::GetBlockHeader(this_00);
    std::span<const_CBlockHeader,_18446744073709551615UL>::span<1UL>
              ((span<const_CBlockHeader,_18446744073709551615UL> *)in_stack_fffffffffffffdb8,
               (type_identity_t<element_type> (*) [1])0xcb3cdd);
    headers._M_extent._M_extent_value._0_4_ = in_stack_fffffffffffffec8;
    headers._M_ptr = (pointer)in_stack_fffffffffffffec0;
    headers._M_extent._M_extent_value._4_4_ = in_stack_fffffffffffffecc;
    in_stack_fffffffffffffdf7 =
         ChainstateManager::ProcessNewBlockHeaders
                   (in_stack_fffffffffffffe40,headers,(bool)min_pow_checked,
                    (BlockValidationState *)state,in_RSI);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)this_00,SUB81((ulong)prev >> 0x38,0));
    in_stack_fffffffffffffde8 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_00,(pointer)prev,
               (unsigned_long)in_stack_fffffffffffffdb8);
    boost::unit_test::operator<<(prev,(basic_cstring<const_char> *)in_stack_fffffffffffffdb8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_00,(pointer)prev,
               (unsigned_long)in_stack_fffffffffffffdb8);
    in_stack_fffffffffffffdb8 = (CChainParams *)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&stack0xfffffffffffffec0,(lazy_ostream *)&stack0xfffffffffffffe90
               ,&local_190,0x68,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffffdb8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffdb8);
    in_stack_fffffffffffffde7 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffffde7);
  std::shared_ptr<CBlock>::shared_ptr
            ((shared_ptr<CBlock> *)in_stack_fffffffffffffdb8,(shared_ptr<CBlock> *)0xcb3e05);
  BlockValidationState::~BlockValidationState((BlockValidationState *)in_stack_fffffffffffffdb8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    sVar4.super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    sVar4.super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar5;
    return (shared_ptr<CBlock>)sVar4.super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>;
  }
  __stack_chk_fail();
}

Assistant:

std::shared_ptr<CBlock> MinerTestingSetup::FinalizeBlock(std::shared_ptr<CBlock> pblock)
{
    const CBlockIndex* prev_block{WITH_LOCK(::cs_main, return m_node.chainman->m_blockman.LookupBlockIndex(pblock->hashPrevBlock))};
    m_node.chainman->GenerateCoinbaseCommitment(*pblock, prev_block);

    pblock->hashMerkleRoot = BlockMerkleRoot(*pblock);

    while (!CheckProofOfWork(pblock->GetHash(), pblock->nBits, Params().GetConsensus())) {
        ++(pblock->nNonce);
    }

    // submit block header, so that miner can get the block height from the
    // global state and the node has the topology of the chain
    BlockValidationState ignored;
    BOOST_CHECK(Assert(m_node.chainman)->ProcessNewBlockHeaders({{pblock->GetBlockHeader()}}, true, ignored));

    return pblock;
}